

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_SimdBool8x16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  long lVar1;
  long lVar2;
  SIMDValue SVar3;
  bool local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  bool values [16];
  
  lVar1 = *(long *)(this + 0x118);
  local_28 = *(int *)(lVar1 + (ulong)playout->I1 * 4) != 0;
  local_27 = *(int *)(lVar1 + (ulong)playout->I2 * 4) != 0;
  local_26 = *(int *)(lVar1 + (ulong)playout->I3 * 4) != 0;
  local_25 = *(int *)(lVar1 + (ulong)playout->I4 * 4) != 0;
  local_24 = *(int *)(lVar1 + (ulong)playout->I5 * 4) != 0;
  local_23 = *(int *)(lVar1 + (ulong)playout->I6 * 4) != 0;
  local_22 = *(int *)(lVar1 + (ulong)playout->I7 * 4) != 0;
  local_21 = *(int *)(lVar1 + (ulong)playout->I8 * 4) != 0;
  values[0] = *(int *)(lVar1 + (ulong)playout->I9 * 4) != 0;
  values[1] = *(int *)(lVar1 + (ulong)playout->I10 * 4) != 0;
  values[2] = *(int *)(lVar1 + (ulong)playout->I11 * 4) != 0;
  values[3] = *(int *)(lVar1 + (ulong)playout->I12 * 4) != 0;
  values[4] = *(int *)(lVar1 + (ulong)playout->I13 * 4) != 0;
  values[5] = *(int *)(lVar1 + (ulong)playout->I14 * 4) != 0;
  values[6] = *(int *)(lVar1 + (ulong)playout->I15 * 4) != 0;
  values[7] = *(int *)(lVar1 + (ulong)playout->I16 * 4) != 0;
  SVar3 = SIMDBool8x16Operation::OpBool8x16(&local_28);
  lVar1 = *(long *)(this + 0x148);
  lVar2 = (ulong)playout->B16_0 * 0x10;
  *(long *)(lVar1 + lVar2) = SVar3.field_0._0_8_;
  *(long *)(lVar1 + 8 + lVar2) = SVar3.field_0._8_8_;
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdBool8x16(const unaligned T* playout)
    {
        bool values[16];
        values[0] = GetRegRawInt(playout->I1) ? true : false;
        values[1] = GetRegRawInt(playout->I2) ? true : false;
        values[2] = GetRegRawInt(playout->I3) ? true : false;
        values[3] = GetRegRawInt(playout->I4) ? true : false;
        values[4] = GetRegRawInt(playout->I5) ? true : false;
        values[5] = GetRegRawInt(playout->I6) ? true : false;
        values[6] = GetRegRawInt(playout->I7) ? true : false;
        values[7] = GetRegRawInt(playout->I8) ? true : false;
        values[8] = GetRegRawInt(playout->I9) ? true : false;
        values[9] = GetRegRawInt(playout->I10) ? true : false;
        values[10] = GetRegRawInt(playout->I11) ? true : false;
        values[11] = GetRegRawInt(playout->I12) ? true : false;
        values[12] = GetRegRawInt(playout->I13) ? true : false;
        values[13] = GetRegRawInt(playout->I14) ? true : false;
        values[14] = GetRegRawInt(playout->I15) ? true : false;
        values[15] = GetRegRawInt(playout->I16) ? true : false;

        AsmJsSIMDValue result = SIMDBool8x16Operation::OpBool8x16(values);
        SetRegRawSimd(playout->B16_0, result);
    }